

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t stream_recv(Curl_cfilter *cf,Curl_easy *data,stream_ctx *stream,char *buf,size_t len,
                   CURLcode *err)

{
  void *pvVar1;
  _Bool _Var2;
  CURLcode CVar3;
  long local_48;
  ssize_t nread;
  cf_h2_ctx *ctx;
  CURLcode *err_local;
  size_t len_local;
  char *buf_local;
  stream_ctx *stream_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  local_48 = -1;
  *err = CURLE_AGAIN;
  _Var2 = Curl_bufq_is_empty(&stream->recvbuf);
  if ((_Var2) || (local_48 = Curl_bufq_read(&stream->recvbuf,(uchar *)buf,len,err), -1 < local_48))
  {
    if (local_48 < 0) {
      if ((stream->closed & 1U) == 0) {
        if ((((stream->reset & 1U) != 0) ||
            (((*(byte *)((long)pvVar1 + 200) & 1) != 0 &&
             (_Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x18)), _Var2)))) ||
           (((*(byte *)((long)pvVar1 + 200) >> 1 & 1) != 0 &&
            (*(int *)((long)pvVar1 + 0xc4) < stream->id)))) {
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
              (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"[%d] returning ERR",(ulong)(uint)stream->id);
          }
          CVar3 = CURLE_RECV_ERROR;
          if ((stream->bodystarted & 1U) != 0) {
            CVar3 = CURLE_PARTIAL_FILE;
          }
          *err = CVar3;
          local_48 = -1;
        }
      }
      else {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
           && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"[%d] returning CLOSE",(ulong)(uint)stream->id);
        }
        local_48 = http2_handle_stream_close(cf,data,stream,err);
      }
    }
    else if (local_48 == 0) {
      *err = CURLE_AGAIN;
      local_48 = -1;
    }
  }
  if (((local_48 < 0) && (*err != CURLE_AGAIN)) &&
     ((data != (Curl_easy *)0x0 &&
      ((((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 && (cf != (Curl_cfilter *)0x0)) &&
       (0 < cf->cft->log_level)))))) {
    Curl_trc_cf_infof(data,cf,"[%d] stream_recv(len=%zu) -> %zd, %d",(ulong)(uint)stream->id,len,
                      local_48,*err);
  }
  return local_48;
}

Assistant:

static ssize_t stream_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                           struct stream_ctx *stream,
                           char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  ssize_t nread = -1;

  *err = CURLE_AGAIN;
  if(!Curl_bufq_is_empty(&stream->recvbuf)) {
    nread = Curl_bufq_read(&stream->recvbuf,
                           (unsigned char *)buf, len, err);
    if(nread < 0)
      goto out;
    DEBUGASSERT(nread > 0);
  }

  if(nread < 0) {
    if(stream->closed) {
      CURL_TRC_CF(data, cf, "[%d] returning CLOSE", stream->id);
      nread = http2_handle_stream_close(cf, data, stream, err);
    }
    else if(stream->reset ||
            (ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) ||
            (ctx->goaway && ctx->last_stream_id < stream->id)) {
      CURL_TRC_CF(data, cf, "[%d] returning ERR", stream->id);
      *err = stream->bodystarted? CURLE_PARTIAL_FILE : CURLE_RECV_ERROR;
      nread = -1;
    }
  }
  else if(nread == 0) {
    *err = CURLE_AGAIN;
    nread = -1;
  }

out:
  if(nread < 0 && *err != CURLE_AGAIN)
    CURL_TRC_CF(data, cf, "[%d] stream_recv(len=%zu) -> %zd, %d",
                stream->id, len, nread, *err);
  return nread;
}